

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantPool.cc
# Opt level: O1

size_t __thiscall flow::ConstantPool::makeHandler(ConstantPool *this,string *name)

{
  pointer ppVar1;
  pointer __s2;
  size_t sVar2;
  size_t __n;
  int iVar3;
  long lVar4;
  size_type *psVar5;
  size_t sVar6;
  size_t sVar7;
  
  ppVar1 = (this->handlers_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->handlers_).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1;
  if (lVar4 == 0) {
    sVar6 = 0;
  }
  else {
    sVar6 = (lVar4 >> 3) * 0x6db6db6db6db6db7;
    __s2 = (name->_M_dataplus)._M_p;
    sVar2 = name->_M_string_length;
    psVar5 = &(ppVar1->first)._M_string_length;
    sVar7 = 0;
    do {
      __n = *psVar5;
      if (__n == sVar2) {
        if (__n == 0) {
          return sVar7;
        }
        iVar3 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar5 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar3 == 0) {
          return sVar7;
        }
      }
      sVar7 = sVar7 + 1;
      psVar5 = psVar5 + 7;
    } while (sVar6 - sVar7 != 0);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
  ::resize(&this->handlers_,sVar6 + 1);
  std::__cxx11::string::_M_assign
            ((string *)
             ((this->handlers_).
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + sVar6));
  return sVar6;
}

Assistant:

size_t ConstantPool::makeHandler(const std::string& name) {
  size_t i = 0;
  size_t e = handlers_.size();

  while (i != e) {
    if (handlers_[i].first == name) {
      return i;
    }

    ++i;
  }

  handlers_.resize(i + 1);
  handlers_[i].first = name;
  return i;
}